

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cc
# Opt level: O1

Optional<Rect> * __thiscall
SDL2pp::Renderer::GetClipRect(Optional<Rect> *__return_storage_ptr__,Renderer *this)

{
  bool bVar1;
  SDL_Rect rect;
  undefined8 local_20;
  int local_18;
  int local_14;
  
  SDL_RenderGetClipRect(this->renderer_,&local_20);
  if ((local_18 < 1) || (local_14 < 1)) {
    (__return_storage_ptr__->super___optional_storage<SDL2pp::Rect,_true>).field_0.__null_state_ =
         '\0';
    bVar1 = false;
  }
  else {
    *(undefined8 *)&(__return_storage_ptr__->super___optional_storage<SDL2pp::Rect,_true>).field_0 =
         local_20;
    (__return_storage_ptr__->super___optional_storage<SDL2pp::Rect,_true>).field_0.__val_.
    super_SDL_Rect.w = local_18;
    (__return_storage_ptr__->super___optional_storage<SDL2pp::Rect,_true>).field_0.__val_.
    super_SDL_Rect.h = local_14;
    bVar1 = true;
  }
  (__return_storage_ptr__->super___optional_storage<SDL2pp::Rect,_true>).__engaged_ = bVar1;
  return __return_storage_ptr__;
}

Assistant:

Optional<Rect> Renderer::GetClipRect() const {
	SDL_Rect rect;
	SDL_RenderGetClipRect(renderer_, &rect);

	if (SDL_RectEmpty(&rect))
		return NullOpt;
	else
		return Rect(rect);
}